

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

FederateState * __thiscall
helics::CommonCore::getFederateAt(CommonCore *this,LocalFederateId federateID)

{
  shared_mutex *__rwlock;
  pointer puVar1;
  _Head_base<0UL,_helics::FederateState_*,_false> _Var2;
  
  __rwlock = &(this->federates).m_mutex;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  puVar1 = (this->federates).m_obj.dataStorage.
           super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(long)federateID.fid <
      (ulong)((long)(this->federates).m_obj.dataStorage.
                    super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    _Var2._M_head_impl = *(FederateState **)&puVar1[federateID.fid]._M_t;
  }
  else {
    _Var2._M_head_impl = (FederateState *)0x0;
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  return (FederateState *)
         (tuple<helics::FederateState_*,_std::default_delete<helics::FederateState>_>)
         _Var2._M_head_impl;
}

Assistant:

FederateState* CommonCore::getFederateAt(LocalFederateId federateID) const
{
    auto feds = federates.lock();
    return (*feds)[federateID.baseValue()];
}